

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_setup_multiple_outputs1(APITests *this)

{
  initializer_list<int> __l;
  allocator_type local_49;
  void *local_48 [2];
  long local_38;
  int local_30 [3];
  int local_24;
  int *local_20;
  undefined8 local_18;
  
  GPIO::setmode(BOARD);
  local_30[2] = (this->pin_data).out_a;
  local_20 = local_30 + 2;
  local_24 = (this->pin_data).out_b;
  local_18 = 2;
  local_30[0] = 1;
  local_30[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,__l,&local_49);
  GPIO::setup((initializer_list *)&local_20,OUT,(vector *)local_48);
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_multiple_outputs1()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup({pin_data.out_a, pin_data.out_b}, GPIO::OUT, {GPIO::HIGH, GPIO::LOW});
        GPIO::cleanup();
    }